

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O1

int blake2sp_update(blake2sp_state *S,void *pin,size_t inlen)

{
  long lVar1;
  ulong uVar2;
  void *pin_00;
  blake2sp_state *S_00;
  void *local_40;
  size_t local_38;
  
  local_38 = S->buflen;
  local_40 = pin;
  if (local_38 != 0) {
    uVar2 = 0x200 - local_38;
    if (inlen < uVar2) goto LAB_00181310;
    memcpy(S->buf + local_38,pin,uVar2);
    lVar1 = 0;
    S_00 = S;
    do {
      blake2s_update((blake2s_state *)S_00,S->buf + lVar1,0x40);
      lVar1 = lVar1 + 0x40;
      S_00 = (blake2sp_state *)(S_00->S + 1);
    } while (lVar1 != 0x200);
    local_40 = (void *)((long)pin + uVar2);
    inlen = inlen - uVar2;
  }
  local_38 = 0;
LAB_00181310:
  lVar1 = 0;
  do {
    if (0x1ff < inlen) {
      pin_00 = (void *)(lVar1 * 0x40 + (long)local_40);
      uVar2 = inlen;
      do {
        blake2s_update(S->S[lVar1],pin_00,0x40);
        pin_00 = (void *)((long)pin_00 + 0x200);
        uVar2 = uVar2 - 0x200;
      } while (0x1ff < uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  uVar2 = inlen & 0x1ff;
  if (uVar2 != 0) {
    memcpy(S->buf + local_38,(void *)((long)local_40 + (inlen & 0xfffffffffffffe00)),uVar2);
  }
  S->buflen = uVar2 + local_38;
  return 0;
}

Assistant:

int blake2sp_update( blake2sp_state *S, const void *pin, size_t inlen )
{
  const unsigned char * in = (const unsigned char *)pin;
  size_t left = S->buflen;
  size_t fill = sizeof( S->buf ) - left;
  size_t i;

  if( left && inlen >= fill )
  {
    memcpy( S->buf + left, in, fill );

    for( i = 0; i < PARALLELISM_DEGREE; ++i )
      blake2s_update( S->S[i], S->buf + i * BLAKE2S_BLOCKBYTES, BLAKE2S_BLOCKBYTES );

    in += fill;
    inlen -= fill;
    left = 0;
  }

#if defined(_OPENMP)
  #pragma omp parallel shared(S), num_threads(PARALLELISM_DEGREE)
#else
  for( i = 0; i < PARALLELISM_DEGREE; ++i )
#endif
  {
#if defined(_OPENMP)
    size_t      i = omp_get_thread_num();
#endif
    size_t inlen__ = inlen;
    const unsigned char *in__ = ( const unsigned char * )in;
    in__ += i * BLAKE2S_BLOCKBYTES;

    while( inlen__ >= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES )
    {
      blake2s_update( S->S[i], in__, BLAKE2S_BLOCKBYTES );
      in__ += PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
      inlen__ -= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
    }
  }

  in += inlen - inlen % ( PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES );
  inlen %= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;

  if( inlen > 0 )
    memcpy( S->buf + left, in, inlen );

  S->buflen = left + inlen;
  return 0;
}